

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bool fmt::v5::internal::grisu2_gen_digits
               (char *buf,int *size,uint32_t hi,uint64_t lo,int *exp,uint64_t delta,fp *one,fp *diff
               ,int max_digits)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  uint64_t uVar7;
  
  do {
    if (*exp < 1) {
      do {
        cVar6 = (char)(lo * 10 >> (-(char)one->e & 0x3fU));
        iVar5 = *size;
        if (cVar6 != '\0' || iVar5 != 0) {
          *size = iVar5 + 1;
          buf[iVar5] = cVar6 + '0';
        }
        delta = delta * 10;
        uVar7 = one->f;
        lo = uVar7 - 1 & lo * 10;
        iVar5 = *exp;
        *exp = iVar5 + -1;
      } while (*size <= max_digits && delta <= lo);
      bVar3 = grisu2_round(buf,size,max_digits,delta,lo,uVar7,
                           (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 +
                                           (1 - (long)iVar5) * 4) * diff->f,exp);
      return bVar3;
    }
    switch(*exp) {
    case 1:
      uVar2 = 0;
      uVar4 = hi;
      goto LAB_0023996c;
    case 2:
      uVar4 = hi / 10;
      iVar5 = (hi / 10) * 10;
      break;
    case 3:
      uVar4 = hi / 100;
      iVar5 = (hi / 100) * 100;
      break;
    case 4:
      uVar4 = hi / 1000;
      iVar5 = (hi / 1000) * 1000;
      break;
    case 5:
      uVar4 = hi / 10000;
      iVar5 = (hi / 10000) * 10000;
      break;
    case 6:
      uVar4 = (hi >> 5) / 0xc35;
      iVar5 = ((hi >> 5) / 0xc35) * 100000;
      break;
    case 7:
      uVar4 = hi / 1000000;
      iVar5 = (hi / 1000000) * 1000000;
      break;
    case 8:
      uVar4 = hi / 10000000;
      iVar5 = (hi / 10000000) * 10000000;
      break;
    case 9:
      uVar4 = hi / 100000000;
      iVar5 = (hi / 100000000) * 100000000;
      break;
    case 10:
      uVar2 = (uint)((ulong)(hi >> 9) * 0x44b83 >> 0x20);
      uVar4 = uVar2 >> 7;
      iVar5 = (uVar2 >> 7) * 1000000000;
      break;
    default:
      uVar2 = hi;
      uVar4 = 0;
      goto LAB_0023996c;
    }
    uVar2 = hi - iVar5;
LAB_0023996c:
    hi = uVar2;
    iVar5 = *size;
    if (uVar4 != 0 || iVar5 != 0) {
      *size = iVar5 + 1;
      buf[iVar5] = (char)uVar4 + '0';
    }
    iVar5 = *exp;
    *exp = iVar5 + -1;
    bVar1 = -(char)one->e;
    uVar7 = ((ulong)hi << (bVar1 & 0x3f)) + lo;
    if (max_digits < *size || uVar7 <= delta) {
      bVar3 = grisu2_round(buf,size,max_digits,delta,uVar7,
                           (ulong)*(uint *)(&DAT_0025270c + (long)iVar5 * 4) << (bVar1 & 0x3f),
                           diff->f,exp);
      return bVar3;
    }
  } while( true );
}

Assistant:

FMT_FUNC bool grisu2_gen_digits(
    char *buf, int &size, uint32_t hi, uint64_t lo, int &exp,
    uint64_t delta, const fp &one, const fp &diff, int max_digits) {
  // Generate digits for the most significant part (hi).
  while (exp > 0) {
    uint32_t digit = 0;
    // This optimization by miloyip reduces the number of integer divisions by
    // one per iteration.
    switch (exp) {
    case 10: digit = hi / 1000000000; hi %= 1000000000; break;
    case  9: digit = hi /  100000000; hi %=  100000000; break;
    case  8: digit = hi /   10000000; hi %=   10000000; break;
    case  7: digit = hi /    1000000; hi %=    1000000; break;
    case  6: digit = hi /     100000; hi %=     100000; break;
    case  5: digit = hi /      10000; hi %=      10000; break;
    case  4: digit = hi /       1000; hi %=       1000; break;
    case  3: digit = hi /        100; hi %=        100; break;
    case  2: digit = hi /         10; hi %=         10; break;
    case  1: digit = hi;              hi =           0; break;
    default:
      FMT_ASSERT(false, "invalid number of digits");
    }
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    --exp;
    uint64_t remainder = (static_cast<uint64_t>(hi) << -one.e) + lo;
    if (remainder <= delta || size > max_digits) {
      return grisu2_round(
            buf, size, max_digits, delta, remainder,
            static_cast<uint64_t>(data::POWERS_OF_10_32[exp]) << -one.e,
            diff.f, exp);
    }
  }
  // Generate digits for the least significant part (lo).
  for (;;) {
    lo *= 10;
    delta *= 10;
    char digit = static_cast<char>(lo >> -one.e);
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    lo &= one.f - 1;
    --exp;
    if (lo < delta || size > max_digits) {
      return grisu2_round(buf, size, max_digits, delta, lo, one.f,
                          diff.f * data::POWERS_OF_10_32[-exp], exp);
    }
  }
}